

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O1

ssize_t __thiscall BufferWriter::write(BufferWriter *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  undefined4 in_XMM0_Da;
  
  bVar3 = isFull(this);
  if (!bVar3) {
    pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = this->offset;
    *(undefined4 *)(pcVar1 + sVar2) = in_XMM0_Da;
    this->offset = sVar2 + 4;
    return (ssize_t)pcVar1;
  }
  __assert_fail("!isFull()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/buffer_writer.cpp"
                ,0xe,"void BufferWriter::write(float)");
}

Assistant:

void BufferWriter::write(float value)
{
	assert(!isFull());
	*((float*) (data.data() + offset)) = value;
	offset += sizeof(float);
}